

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnlyAssignedOnReset.cpp
# Opt level: O0

string * __thiscall OnlyAssignedOnReset::description_abi_cxx11_(OnlyAssignedOnReset *this)

{
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string *__lhs;
  undefined8 in_stack_ffffffffffffffd0;
  string_view in_stack_ffffffffffffffd8;
  
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          &stack0xffffffffffffffbc;
  __lhs = in_RDI;
  ::fmt::v11::text_style::text_style((text_style *)__rhs,(emphasis)((ulong)in_RDI >> 0x38));
  ::fmt::v11::format<>
            ((text_style *)in_stack_ffffffffffffffd0,(format_string<>)in_stack_ffffffffffffffd8);
  std::operator+((char *)__lhs,__rhs);
  std::__cxx11::string::~string(__rhs);
  return in_RDI;
}

Assistant:

std::string description() const override {
        return "A register in an always_ff only have value while the design is on reset.\n\n" +
               fmt::format(fmt::emphasis::italic,
                           "module m (logic clk, logic reset);\n"
                           "    logic r;\n"
                           "    always_ff @(posedge clk or negedge reset) begin\n"
                           "        if (~reset) begin\n"
                           "            r <= 1'b0;\n"
                           "        end\n"
                           "        begin\n"
                           "            ~~r do not have a value when design is not in reset\n"
                           "        end\n"
                           "    end\n"
                           "endmodule\n");
    }